

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_OrderedExtras_Test::TestBody(SubcommandProgram_OrderedExtras_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  bool bVar1;
  char *pcVar2;
  App *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_730;
  AssertHelper local_6d0;
  Message local_6c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6bf;
  undefined1 local_6be;
  allocator local_6bd;
  allocator local_6bc;
  allocator local_6bb;
  allocator local_6ba;
  allocator local_6b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  iterator local_610;
  size_type local_608;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_600;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_5;
  Message local_5b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5ad;
  undefined1 local_5ac;
  allocator local_5ab;
  allocator local_5aa;
  allocator local_5a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_580 [32];
  string local_560 [32];
  iterator local_540;
  size_type local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_4;
  Message local_4e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4dc;
  undefined1 local_4db;
  allocator local_4da;
  allocator local_4d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string local_4b0 [32];
  iterator local_490;
  size_type local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  iterator local_370;
  size_type local_368;
  AssertHelper local_360;
  Message local_358;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_34e;
  undefined1 local_34d;
  allocator local_34c;
  allocator local_34b;
  allocator local_34a;
  allocator local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  iterator local_2c0;
  size_type local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_2;
  Message local_268;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_25c;
  undefined1 local_25b;
  allocator local_25a;
  allocator local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230 [32];
  iterator local_210;
  size_type local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  Message local_1b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ac;
  undefined1 local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  iterator local_160;
  size_type local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  Message local_108 [2];
  ExtrasError *anon_var_0;
  char *pcStack_f0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_e0;
  allocator local_df;
  allocator local_de;
  allocator local_dd [20];
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  SubcommandProgram_OrderedExtras_Test *this_local;
  
  local_10 = (undefined1  [8])this;
  CLI::App::allow_extras(&(this->super_SubcommandProgram).super_TApp.app,true);
  gtest_msg.value._7_1_ = 1;
  local_c8 = &local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"one",&local_c9);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"two",local_dd);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"start",&local_de);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"three",&local_df);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"four",&local_e0);
  gtest_msg.value._7_1_ = 0;
  local_20 = &local_c0;
  local_18 = 5;
  __l_06._M_len = 5;
  __l_06._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_06);
  local_730 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_730 = local_730 + -1;
    std::__cxx11::string::~string((string *)local_730);
  } while (local_730 != &local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_df);
  std::allocator<char>::~allocator((allocator<char> *)&local_de);
  std::allocator<char>::~allocator((allocator<char> *)local_dd);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff10);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run((TApp *)this);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0012aa21;
    pcStack_f0 = 
    "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_108);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x24c,pcStack_f0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_108);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_108);
LAB_0012aa21:
  this_00 = &(this->super_SubcommandProgram).super_TApp.app;
  CLI::App::reset(this_00);
  CLI::App::allow_extras((this->super_SubcommandProgram).start,true);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_138,this_00,false);
  local_1ab = 1;
  local_1a8 = &local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"one",&local_1a9);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"two",&local_1aa);
  local_1ab = 0;
  local_160 = &local_1a0;
  local_158 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1ac);
  __l_05._M_len = local_158;
  __l_05._M_array = local_160;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,__l_05,&local_1ac);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_120,"app.remaining()",
             "std::vector<std::string>({\"one\", \"two\"})",&local_138,&local_150);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1ac);
  local_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160;
  do {
    local_7a8 = local_7a8 + -1;
    std::__cxx11::string::~string((string *)local_7a8);
  } while (local_7a8 != &local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x253,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  CLI::App::remaining_abi_cxx11_(&local_1e8,(this->super_SubcommandProgram).start,false);
  local_25b = 1;
  local_258 = &local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"three",&local_259);
  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"four",&local_25a);
  local_25b = 0;
  local_210 = &local_250;
  local_208 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_25c);
  __l_04._M_len = local_208;
  __l_04._M_array = local_210;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,__l_04,&local_25c);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_1d0,"start->remaining()",
             "std::vector<std::string>({\"three\", \"four\"})",&local_1e8,&local_200);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_25c);
  local_820 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210;
  do {
    local_820 = local_820 + -1;
    std::__cxx11::string::~string((string *)local_820);
  } while (local_820 != &local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_25a);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x254,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  CLI::App::remaining_abi_cxx11_(&local_298,&(this->super_SubcommandProgram).super_TApp.app,true);
  local_34d = 1;
  local_348 = &local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"one",&local_349);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"two",&local_34a);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"three",&local_34b);
  local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"four",&local_34c);
  local_34d = 0;
  local_2c0 = &local_340;
  local_2b8 = 4;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_34e);
  __l_03._M_len = local_2b8;
  __l_03._M_array = local_2c0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b0,__l_03,&local_34e);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_280,"app.remaining(true)",
             "std::vector<std::string>({\"one\", \"two\", \"three\", \"four\"})",&local_298,
             &local_2b0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_34e);
  local_8b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c0;
  do {
    local_8b8 = local_8b8 + -1;
    std::__cxx11::string::~string((string *)local_8b8);
  } while (local_8b8 != &local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_34c);
  std::allocator<char>::~allocator((allocator<char> *)&local_34b);
  std::allocator<char>::~allocator((allocator<char> *)&local_34a);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x255,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  gtest_ar_3.message_.ptr_._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_430,"one",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"two",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"start",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 5))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"three",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 4))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"--",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"four",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 2));
  gtest_ar_3.message_.ptr_._1_1_ = 0;
  local_370 = &local_430;
  local_368 = 6;
  __l_02._M_len = 6;
  __l_02._M_array = local_370;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_02);
  local_968 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370;
  do {
    local_968 = local_968 + -1;
    std::__cxx11::string::~string((string *)local_968);
  } while (local_968 != &local_430);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_468,&(this->super_SubcommandProgram).super_TApp.app,false);
  local_4db = 1;
  local_4d8 = &local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"one",&local_4d9);
  local_4d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"two",&local_4da);
  local_4db = 0;
  local_490 = &local_4d0;
  local_488 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_4dc);
  __l_01._M_len = local_488;
  __l_01._M_array = local_490;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_480,__l_01,&local_4dc);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_450,"app.remaining()",
             "std::vector<std::string>({\"one\", \"two\"})",&local_468,&local_480);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_480);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_4dc);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_490;
  do {
    local_9a8 = local_9a8 + -1;
    std::__cxx11::string::~string((string *)local_9a8);
  } while (local_9a8 != &local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4da);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x25c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  CLI::App::remaining_abi_cxx11_(&local_518,(this->super_SubcommandProgram).start,false);
  local_5ac = 1;
  local_5a8 = &local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a0,"three",&local_5a9);
  local_5a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"--",&local_5aa);
  local_5a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"four",&local_5ab);
  local_5ac = 0;
  local_540 = &local_5a0;
  local_538 = 3;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5ad);
  __l_00._M_len = local_538;
  __l_00._M_array = local_540;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_530,__l_00,&local_5ad);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_500,"start->remaining()",
             "std::vector<std::string>({\"three\", \"--\", \"four\"})",&local_518,&local_530);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_530);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5ad);
  local_a58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_540;
  do {
    local_a58 = local_a58 + -1;
    std::__cxx11::string::~string((string *)local_a58);
  } while (local_a58 != &local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5ab);
  std::allocator<char>::~allocator((allocator<char> *)&local_5aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x25d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  CLI::App::remaining_abi_cxx11_(&local_5e8,&(this->super_SubcommandProgram).super_TApp.app,true);
  local_6be = 1;
  local_6b8 = &local_6b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b0,"one",&local_6b9);
  local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"two",&local_6ba);
  local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"three",&local_6bb);
  local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"--",&local_6bc);
  local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"four",&local_6bd);
  local_6be = 0;
  local_610 = &local_6b0;
  local_608 = 5;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6bf);
  __l._M_len = local_608;
  __l._M_array = local_610;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_600,__l,&local_6bf);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_5d0,"app.remaining(true)",
             "std::vector<std::string>({\"one\", \"two\", \"three\", \"--\", \"four\"})",&local_5e8,
             &local_600);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_600);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6bf);
  local_b00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_610;
  do {
    local_b00 = local_b00 + -1;
    std::__cxx11::string::~string((string *)local_b00);
  } while (local_b00 != &local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6bd);
  std::allocator<char>::~allocator((allocator<char> *)&local_6bc);
  std::allocator<char>::~allocator((allocator<char> *)&local_6bb);
  std::allocator<char>::~allocator((allocator<char> *)&local_6ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x25e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  return;
}

Assistant:

TEST_F(SubcommandProgram, OrderedExtras) {

    app.allow_extras();
    args = {"one", "two", "start", "three", "four"};
    EXPECT_THROW(run(), CLI::ExtrasError);
    app.reset();

    start->allow_extras();

    run();

    EXPECT_EQ(app.remaining(), std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(start->remaining(), std::vector<std::string>({"three", "four"}));
    EXPECT_EQ(app.remaining(true), std::vector<std::string>({"one", "two", "three", "four"}));

    app.reset();
    args = {"one", "two", "start", "three", "--", "four"};

    run();

    EXPECT_EQ(app.remaining(), std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(start->remaining(), std::vector<std::string>({"three", "--", "four"}));
    EXPECT_EQ(app.remaining(true), std::vector<std::string>({"one", "two", "three", "--", "four"}));
}